

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Scene * __thiscall CS248::DynamicScene::Scene::get_static_scene(Scene *this)

{
  _Base_ptr p_Var1;
  Scene *this_00;
  SceneObject *staticObject;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  staticLights;
  vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  staticObjects;
  
  staticObjects.
  super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  staticObjects.
  super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  staticObjects.
  super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  staticLights.
  super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  staticLights.
  super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  staticLights.
  super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    staticObject = (SceneObject *)(**(code **)(**(long **)(p_Var1 + 1) + 0x38))();
    if (staticObject != (SceneObject *)0x0) {
      std::
      vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
      ::push_back(&staticObjects,&staticObject);
    }
  }
  for (p_Var1 = (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->lights)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    staticObject = (SceneObject *)(**(code **)**(undefined8 **)(p_Var1 + 1))();
    std::vector<CS248::StaticScene::SceneLight*,std::allocator<CS248::StaticScene::SceneLight*>>::
    emplace_back<CS248::StaticScene::SceneLight*>
              ((vector<CS248::StaticScene::SceneLight*,std::allocator<CS248::StaticScene::SceneLight*>>
                *)&staticLights,(SceneLight **)&staticObject);
  }
  this_00 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene(this_00,&staticObjects,&staticLights);
  std::
  _Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ::~_Vector_base(&staticLights.
                   super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
                 );
  std::
  _Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ::~_Vector_base(&staticObjects.
                   super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
                 );
  return this_00;
}

Assistant:

StaticScene::Scene *Scene::get_static_scene() {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_static_object();
    if (staticObject != nullptr) staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }

  return new StaticScene::Scene(staticObjects, staticLights);
}